

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

bool absl::lts_20250127::operator<(Duration lhs,Duration rhs)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int64_t iVar3;
  int64_t iVar4;
  long lVar5;
  uint uVar6;
  uint32_t extraout_EDX_00;
  HiRep this;
  HiRep this_00;
  Duration d;
  Duration d_00;
  Duration d_01;
  Duration d_02;
  Duration d_03;
  Duration d_04;
  Duration d_05;
  Duration d_06;
  Duration d_07;
  undefined1 local_161;
  undefined1 local_149;
  Duration rhs_local;
  Duration lhs_local;
  uint32_t extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  
  uVar6 = rhs.rep_lo_;
  this = rhs.rep_hi_;
  d.rep_hi_.lo_ = lhs.rep_lo_;
  this_00 = lhs.rep_hi_;
  d.rep_hi_.hi_ = 0;
  d.rep_lo_ = rhs.rep_hi_.lo_;
  iVar3 = time_internal::GetRepHi((time_internal *)this_00,d);
  d_00.rep_hi_.hi_ = 0;
  d_00.rep_hi_.lo_ = uVar6;
  d_00.rep_lo_ = (uint32_t)extraout_RDX;
  iVar4 = time_internal::GetRepHi((time_internal *)this,d_00);
  if (iVar3 == iVar4) {
    d_03.rep_hi_.hi_ = 0;
    d_03.rep_hi_.lo_ = d.rep_hi_.lo_;
    d_03.rep_lo_ = extraout_EDX;
    iVar3 = time_internal::GetRepHi((time_internal *)this_00,d_03);
    lVar5 = std::numeric_limits<long>::min();
    if (iVar3 == lVar5) {
      d_04.rep_hi_.hi_ = 0;
      d_04.rep_hi_.lo_ = d.rep_hi_.lo_;
      d_04.rep_lo_ = extraout_EDX_00;
      uVar1 = time_internal::GetRepLo((time_internal *)this_00,d_04);
      d_05.rep_hi_.hi_ = 0;
      d_05.rep_hi_.lo_ = uVar6;
      d_05.rep_lo_ = (uint32_t)extraout_RDX_01;
      uVar2 = time_internal::GetRepLo((time_internal *)this,d_05);
      local_161 = uVar1 + 1 < uVar2 + 1;
    }
    else {
      d_06.rep_hi_.hi_ = 0;
      d_06.rep_hi_.lo_ = d.rep_hi_.lo_;
      d_06.rep_lo_ = extraout_EDX_00;
      uVar1 = time_internal::GetRepLo((time_internal *)this_00,d_06);
      d_07.rep_hi_.hi_ = 0;
      d_07.rep_hi_.lo_ = uVar6;
      d_07.rep_lo_ = (uint32_t)extraout_RDX_02;
      uVar2 = time_internal::GetRepLo((time_internal *)this,d_07);
      local_161 = uVar1 < uVar2;
    }
    local_149 = local_161;
  }
  else {
    d_01.rep_hi_.hi_ = 0;
    d_01.rep_hi_.lo_ = d.rep_hi_.lo_;
    d_01.rep_lo_ = extraout_EDX;
    iVar3 = time_internal::GetRepHi((time_internal *)this_00,d_01);
    d_02.rep_hi_.hi_ = 0;
    d_02.rep_hi_.lo_ = uVar6;
    d_02.rep_lo_ = (uint32_t)extraout_RDX_00;
    iVar4 = time_internal::GetRepHi((time_internal *)this,d_02);
    local_149 = iVar3 < iVar4;
  }
  return local_149;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr bool operator<(Duration lhs,
                                                       Duration rhs) {
  return time_internal::GetRepHi(lhs) != time_internal::GetRepHi(rhs)
             ? time_internal::GetRepHi(lhs) < time_internal::GetRepHi(rhs)
         : time_internal::GetRepHi(lhs) == (std::numeric_limits<int64_t>::min)()
             ? time_internal::GetRepLo(lhs) + 1 <
                   time_internal::GetRepLo(rhs) + 1
             : time_internal::GetRepLo(lhs) < time_internal::GetRepLo(rhs);
}